

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_hex_enum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar3 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar3 = (long)buf[6] << 8;
    case 6:
      uVar3 = uVar3 | (long)buf[5] << 0x10;
    case 5:
      uVar3 = uVar3 | (long)buf[4] << 0x18;
    case 4:
      uVar3 = uVar3 | (long)buf[3] << 0x20;
    case 3:
      uVar3 = uVar3 | (long)buf[2] << 0x28;
    case 2:
      uVar3 = uVar3 | (long)buf[1] << 0x30;
    case 1:
      uVar3 = (ulong)(byte)*buf << 0x38 | uVar3;
      break;
    default:
      goto switchD_001137c8_default;
    }
  }
  else {
    uVar3 = *(ulong *)buf;
    uVar3 = (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
            (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
            uVar3 << 0x38;
  }
  if ((uint)(uVar3 >> 0x21) < 0x3432bc19) {
    if ((uVar3 & 0x7fffffff00000000) != 0x6865783100000000) {
      return buf;
    }
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    iVar2 = 0;
    uVar4 = 3;
  }
  else if (uVar3 >> 0x10 == 0x6865786e6567) {
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,6,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    iVar2 = 1;
    uVar4 = 0xfffffffffffffffe;
  }
  else {
    if ((uVar3 & 0xffffffff00000000) != 0x6865783200000000) {
      return buf;
    }
    pcVar1 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar1 == buf) {
      return buf;
    }
    iVar2 = 0;
    uVar4 = 0x7eafbeaf;
  }
  *value = uVar4;
  *value_sign = iVar2;
  buf = pcVar1;
switchD_001137c8_default:
  return buf;
}

Assistant:

static const char *MyGame_Example_hex_enum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6865783200000000) { /* branch "hex2" */
        if ((w & 0xffffffff00000000) == 0x6865783100000000) { /* "hex1" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(3), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "hex1" */
            return unmatched;
        } /* "hex1" */
    } else { /* branch "hex2" */
        if ((w & 0xffffffffffff0000) == 0x6865786e65670000) { /* "hexneg" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 6, aggregate);
            if (buf != mark) {
                *value = UINT64_C(18446744073709551614), *value_sign = 1;
            } else {
                return unmatched;
            }
        } else { /* "hexneg" */
            if ((w & 0xffffffff00000000) == 0x6865783200000000) { /* "hex2" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(2125446831), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "hex2" */
                return unmatched;
            } /* "hex2" */
        } /* "hexneg" */
    } /* branch "hex2" */
    return buf;
}